

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bif.c
# Opt level: O0

void bifcvn(bifcxdef *ctx,int argc)

{
  long lVar1;
  void *p_00;
  int iVar2;
  ushort **ppuVar3;
  long in_RDI;
  int neg;
  long acc;
  int typ;
  int len;
  uchar *p;
  runsdef val;
  int in_stack_ffffffffffffffac;
  uint in_stack_ffffffffffffffb0;
  undefined1 in_stack_ffffffffffffffb4;
  undefined1 in_stack_ffffffffffffffb5;
  bool bVar4;
  undefined1 in_stack_ffffffffffffffb6;
  undefined1 in_stack_ffffffffffffffb7;
  void *pvVar5;
  dattyp typ_00;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  int local_2c;
  byte *local_28;
  
  lVar1 = *(long *)(*(long *)(in_RDI + 8) + 0x20);
  *(long *)(*(long *)(in_RDI + 8) + 0x20) = lVar1 + -0x10;
  if (*(char *)(lVar1 + -0x10) != '\x03') {
    *(undefined4 *)(*(long *)**(undefined8 **)(in_RDI + 8) + 0x68) = 0;
    runsign((runcxdef *)
            CONCAT17(in_stack_ffffffffffffffb7,
                     CONCAT16(in_stack_ffffffffffffffb6,
                              CONCAT15(in_stack_ffffffffffffffb5,
                                       CONCAT14(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0)
                                      ))),in_stack_ffffffffffffffac);
  }
  p_00 = *(void **)(*(long *)(*(long *)(in_RDI + 8) + 0x20) + 8);
  pvVar5 = p_00;
  local_2c = osrp2(p_00);
  local_2c = local_2c + -2;
  local_28 = (byte *)((long)p_00 + 2);
  if (local_2c == 3) {
    iVar2 = memcmp(local_28,"nil",3);
    typ_00 = (dattyp)((ulong)pvVar5 >> 0x20);
    if (iVar2 == 0) goto LAB_00269b56;
  }
  typ_00 = (dattyp)((ulong)pvVar5 >> 0x20);
  if ((local_2c != 4) || (*(int *)local_28 != 0x65757274)) {
    while( true ) {
      bVar4 = false;
      if ((local_2c != 0) &&
         (in_stack_ffffffffffffffb6 = false, bVar4 = (bool)in_stack_ffffffffffffffb6,
         *local_28 < 0x80)) {
        ppuVar3 = __ctype_b_loc();
        in_stack_ffffffffffffffb6 = ((*ppuVar3)[(int)(uint)*local_28] & 0x2000) != 0;
        bVar4 = (bool)in_stack_ffffffffffffffb6;
      }
      if (bVar4 == false) break;
      local_28 = local_28 + 1;
      local_2c = local_2c + -1;
    }
    in_stack_ffffffffffffffb7 = 0;
    if ((local_2c == 0) || (*local_28 != 0x2d)) {
      in_stack_ffffffffffffffc4 = 0;
    }
    else {
      in_stack_ffffffffffffffc4 = 1;
      do {
        local_28 = local_28 + 1;
        local_2c = local_2c + -1;
        bVar4 = false;
        if ((local_2c != 0) &&
           (in_stack_ffffffffffffffb4 = false, bVar4 = (bool)in_stack_ffffffffffffffb4,
           *local_28 < 0x80)) {
          ppuVar3 = __ctype_b_loc();
          in_stack_ffffffffffffffb4 = ((*ppuVar3)[(int)(uint)*local_28] & 0x2000) != 0;
          bVar4 = (bool)in_stack_ffffffffffffffb4;
        }
      } while (bVar4 != false);
      in_stack_ffffffffffffffb5 = 0;
    }
    while( true ) {
      in_stack_ffffffffffffffb0 = in_stack_ffffffffffffffb0 & 0xffffff;
      if (local_2c != 0) {
        ppuVar3 = __ctype_b_loc();
        in_stack_ffffffffffffffb0 =
             CONCAT13(((*ppuVar3)[(int)(uint)*local_28] & 0x800) != 0,
                      (int3)in_stack_ffffffffffffffb0);
      }
      typ_00 = (dattyp)((ulong)pvVar5 >> 0x20);
      if ((char)(in_stack_ffffffffffffffb0 >> 0x18) == '\0') break;
      local_28 = local_28 + 1;
      local_2c = local_2c + -1;
    }
  }
LAB_00269b56:
  runpush((runcxdef *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),typ_00,
          (runsdef *)
          CONCAT17(in_stack_ffffffffffffffb7,
                   CONCAT16(in_stack_ffffffffffffffb6,
                            CONCAT15(in_stack_ffffffffffffffb5,
                                     CONCAT14(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0)))
                  ));
  return;
}

Assistant:

void bifcvn(bifcxdef *ctx, int argc)
{
    runsdef  val;
    uchar   *p;
    int      len;
    int      typ;
    long     acc;
    int      neg;
    
    bifcntargs(ctx, 1, argc);
    p = runpopstr(ctx->bifcxrun);
    len = osrp2(p) - 2;
    p += 2;
    
    if (len == 3 && !memcmp(p, "nil", (size_t)3))
        typ = DAT_NIL;
    else if (len == 4 && !memcmp(p, "true", (size_t)4))
        typ = DAT_TRUE;
    else
    {
        typ = DAT_NUMBER;
        for ( ; len != 0 && t_isspace(*p) ; ++p, --len) ;
        if (len != 0 && *p == '-')
        {
            neg = TRUE;
            for (++p, --len ; len != 0 && t_isspace(*p) ; ++p, --len) ;
        }
        else neg = FALSE;

        /* accumulate the number digit by digit */
        for (acc = 0 ; len != 0 && isdigit(*p) ; ++p, --len)
            acc = (acc << 3) + (acc << 1) + ((*p) - '0');

        if (neg) acc = -acc;
        val.runsv.runsvnum = acc;
    }
    
    runpush(ctx->bifcxrun, typ, &val);
}